

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws.c
# Opt level: O1

void nn_aws_term(nn_aws *self)

{
  if (self->state == 1) {
    nn_list_item_term(&self->item);
    nn_fsm_event_term(&self->done);
    nn_fsm_event_term(&self->accepted);
    nn_sws_term(&self->sws);
    nn_usock_term(&self->usock);
    nn_fsm_term(&self->fsm);
    return;
  }
  nn_aws_term_cold_1();
}

Assistant:

void nn_aws_term (struct nn_aws *self)
{
    nn_assert_state (self, NN_AWS_STATE_IDLE);

    nn_list_item_term (&self->item);
    nn_fsm_event_term (&self->done);
    nn_fsm_event_term (&self->accepted);
    nn_sws_term (&self->sws);
    nn_usock_term (&self->usock);
    nn_fsm_term (&self->fsm);
}